

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtls.cpp
# Opt level: O1

Error * __thiscall
ot::commissioner::DtlsSession::Send
          (Error *__return_storage_ptr__,DtlsSession *this,ByteArray *aBuf,MessageSubType aSubType)

{
  string *this_00;
  ErrorCode EVar1;
  pointer pcVar2;
  string *this_01;
  char *pcVar3;
  char *from;
  uint uVar4;
  char *to;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  bool bVar5;
  format_args args;
  writer write;
  MessageSubType local_e9;
  string *local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_e0;
  string local_d8;
  undefined1 local_b8 [8];
  _Alloc_hider local_b0;
  size_t local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  parse_func local_90 [1];
  writer local_88;
  ErrorCode local_80;
  undefined1 *local_78 [2];
  undefined1 local_68 [16];
  ErrorCode local_58;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  __return_storage_ptr__->mCode = kNone;
  this_00 = &__return_storage_ptr__->mMessage;
  local_e0 = &(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p = (pointer)local_e0;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  local_e9 = aSubType;
  local_e8 = (string *)this_00;
  if (this->mState != kConnected) {
    local_b8._0_4_ = none_type;
    from = "the DTLS session is not connected";
    local_b0._M_p = "the DTLS session is not connected";
    local_a8 = 0x21;
    local_a0._M_allocated_capacity = 0;
    local_90[0] = (parse_func)0x0;
    local_a0._8_8_ = (format_string_checker<char> *)local_b8;
    local_88.handler_ = (format_string_checker<char> *)local_b8;
    do {
      if (from == "") break;
      to = from;
      if (*from == '{') {
LAB_001c0bdd:
        fmt::v10::detail::
        parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
        operator()(&local_88,from,to);
        from = fmt::v10::detail::
               parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                         (to,"",(format_string_checker<char> *)local_b8);
        bVar5 = true;
      }
      else {
        to = from + 1;
        bVar5 = to != "";
        if (bVar5) {
          if (*to != '{') {
            pcVar3 = from + 2;
            do {
              to = pcVar3;
              bVar5 = to != "";
              if (to == "") goto LAB_001c0bd9;
              pcVar3 = to + 1;
            } while (*to != '{');
          }
          bVar5 = true;
        }
LAB_001c0bd9:
        if (bVar5) goto LAB_001c0bdd;
        fmt::v10::detail::
        parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
        operator()(&local_88,from,"");
        bVar5 = false;
      }
    } while (bVar5);
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)local_b8;
    fmt::v10::vformat_abi_cxx11_
              (&local_d8,(v10 *)"the DTLS session is not connected",(string_view)ZEXT816(0x21),args)
    ;
    this_01 = local_e8;
    local_58 = kInvalidState;
    local_50[0] = local_40;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_50,local_d8._M_dataplus._M_p,
               local_d8._M_dataplus._M_p + local_d8._M_string_length);
    __return_storage_ptr__->mCode = local_58;
    std::__cxx11::string::operator=(this_01,(string *)local_50);
    if (local_50[0] != local_40) {
      operator_delete(local_50[0]);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p == &local_d8.field_2) {
      return __return_storage_ptr__;
    }
    goto LAB_001c0c9f;
  }
  if ((this->mSendQueue).c.
      super__Deque_base<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ot::commissioner::MessageSubType>,_std::allocator<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ot::commissioner::MessageSubType>_>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_cur !=
      (this->mSendQueue).c.
      super__Deque_base<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ot::commissioner::MessageSubType>,_std::allocator<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ot::commissioner::MessageSubType>_>_>
      ._M_impl.super__Deque_impl_data._M_start._M_cur) {
    std::
    deque<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>,ot::commissioner::MessageSubType>,std::allocator<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>,ot::commissioner::MessageSubType>>>
    ::
    emplace_back<std::vector<unsigned_char,std::allocator<unsigned_char>>const&,ot::commissioner::MessageSubType&>
              ((deque<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>,ot::commissioner::MessageSubType>,std::allocator<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>,ot::commissioner::MessageSubType>>>
                *)&this->mSendQueue,aBuf,&local_e9);
    return __return_storage_ptr__;
  }
  Write((Error *)local_b8,this,aBuf,aSubType);
  __return_storage_ptr__->mCode = local_b8._0_4_;
  std::__cxx11::string::operator=((string *)this_00,(string *)&local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_p != &local_a0) {
    operator_delete(local_b0._M_p);
  }
  EVar1 = __return_storage_ptr__->mCode;
  if (EVar1 == kNone) {
LAB_001c0d21:
    uVar4 = 0;
  }
  else {
    local_78[0] = local_68;
    pcVar2 = (__return_storage_ptr__->mMessage)._M_dataplus._M_p;
    local_80 = EVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_78,pcVar2,
               pcVar2 + (__return_storage_ptr__->mMessage)._M_string_length);
    if (kIOBusy < local_80) goto LAB_001c0d21;
    uVar4 = 0x1201 >> ((byte)local_80 & 0x1f);
  }
  if ((EVar1 != kNone) && (local_78[0] != local_68)) {
    operator_delete(local_78[0]);
  }
  if ((uVar4 & 1) == 0) {
    return __return_storage_ptr__;
  }
  std::
  deque<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>,ot::commissioner::MessageSubType>,std::allocator<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>,ot::commissioner::MessageSubType>>>
  ::
  emplace_back<std::vector<unsigned_char,std::allocator<unsigned_char>>const&,ot::commissioner::MessageSubType&>
            ((deque<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>,ot::commissioner::MessageSubType>,std::allocator<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>,ot::commissioner::MessageSubType>>>
              *)&this->mSendQueue,aBuf,&local_e9);
  local_b8._0_4_ = none_type;
  local_a8 = 0;
  local_a0._M_allocated_capacity = local_a0._M_allocated_capacity & 0xffffffffffffff00;
  __return_storage_ptr__->mCode = kNone;
  local_b0._M_p = (pointer)&local_a0;
  std::__cxx11::string::operator=(local_e8,(string *)&local_b0);
  local_d8._M_dataplus._M_p = local_b0._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_p == &local_a0) {
    return __return_storage_ptr__;
  }
LAB_001c0c9f:
  operator_delete(local_d8._M_dataplus._M_p);
  return __return_storage_ptr__;
}

Assistant:

Error DtlsSession::Send(const ByteArray &aBuf, MessageSubType aSubType)
{
    Error error;

    VerifyOrExit(mState == State::kConnected, error = ERROR_INVALID_STATE("the DTLS session is not connected"));

    if (mSendQueue.empty())
    {
        error = Write(aBuf, aSubType);
        if (error != ErrorCode::kNone && !ShouldStop(error))
        {
            mSendQueue.emplace(aBuf, aSubType);

            // hide non-critical error (IO Busy) from caller.
            error = ERROR_NONE;
        }
    }
    else
    {
        mSendQueue.emplace(aBuf, aSubType);
    }

exit:
    return error;
}